

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall GEO::Logger::notify_out(Logger *this,string *message)

{
  iterator iVar1;
  LoggerClient *pLVar2;
  _Base_ptr p_Var3;
  SmartPointer<GEO::LoggerClient> it;
  string feat_msg;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (((this->log_everything_ != true) ||
      (iVar1 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&(this->log_features_exclude_)._M_t,&this->current_feature_),
      (_Rb_tree_header *)iVar1._M_node !=
      &(this->log_features_exclude_)._M_t._M_impl.super__Rb_tree_header)) &&
     (iVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->log_features_)._M_t,&this->current_feature_),
     (_Rb_tree_header *)iVar1._M_node == &(this->log_features_)._M_t._M_impl.super__Rb_tree_header))
  {
    return;
  }
  CmdLine::ui_feature(&local_68,&this->current_feature_,this->current_feature_changed_);
  std::operator+(&local_48,&local_68,message);
  std::__cxx11::string::~string((string *)&local_68);
  for (p_Var3 = (this->clients_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->clients_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    local_68._M_dataplus._M_p = *(pointer *)(p_Var3 + 1);
    if (local_68._M_dataplus._M_p != (pointer)0x0) {
      *(int *)(local_68._M_dataplus._M_p + 8) = *(int *)(local_68._M_dataplus._M_p + 8) + 1;
    }
    pLVar2 = SmartPointer<GEO::LoggerClient>::operator->
                       ((SmartPointer<GEO::LoggerClient> *)&local_68);
    (*(pLVar2->super_Counted)._vptr_Counted[3])(pLVar2,&local_48);
    SmartPointer<GEO::LoggerClient>::~SmartPointer((SmartPointer<GEO::LoggerClient> *)&local_68);
  }
  this->current_feature_changed_ = false;
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void Logger::notify_out(const std::string& message) {
        if(
            (log_everything_ &&
                log_features_exclude_.find(current_feature_) ==
                log_features_exclude_.end())
            || (log_features_.find(current_feature_) != log_features_.end())
        ) {
            std::string feat_msg =
                CmdLine::ui_feature(current_feature_, current_feature_changed_)
                + message;

	    for(auto it : clients_) {
                it->out(feat_msg);
            }

            current_feature_changed_ = false;
        }
    }